

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCuSu.cpp
# Opt level: O0

int __thiscall
NaPNCuSum::verify(NaPNCuSum *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
                 size_t tbslen)

{
  uint uVar1;
  int iVar2;
  NaVector *pNVar3;
  char *pcVar4;
  bool local_11;
  NaPNCuSum *this_00;
  
  this_00 = this;
  pNVar3 = NaPetriCnInput::data((NaPetriCnInput *)this);
  uVar1 = (*pNVar3->_vptr_NaVector[6])();
  if (1 < uVar1) {
    pcVar4 = NaPetriNode::name(&this->super_NaPetriNode);
    NaPrintLog("WARNING! NaPNCuSum \'%s\' is used with vector input but it is capable only for scalar"
               ,pcVar4);
  }
  pNVar3 = NaPetriCnInput::data((NaPetriCnInput *)this_00);
  iVar2 = (*pNVar3->_vptr_NaVector[6])();
  local_11 = false;
  if (iVar2 != 0) {
    pNVar3 = NaPetriCnOutput::data(&this->d);
    iVar2 = (*pNVar3->_vptr_NaVector[6])();
    local_11 = false;
    if (iVar2 == 1) {
      pNVar3 = NaPetriCnOutput::data(&this->sum);
      iVar2 = (*pNVar3->_vptr_NaVector[6])();
      local_11 = iVar2 == 1;
    }
  }
  return (uint)local_11;
}

Assistant:

bool
NaPNCuSum::verify ()
{
    if(x.data().dim() > 1)
	NaPrintLog("WARNING! NaPNCuSum '%s' is used with vector input but it is capable only for scalar", name());
    return x.data().dim() >= 1
	&& 1 == d.data().dim()
	&& 1 == sum.data().dim();
}